

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct16_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in1_14;
  __m256i in1_15;
  __m256i in1_16;
  __m256i in1_17;
  __m256i in1_18;
  __m256i in1_19;
  __m256i in1_20;
  __m256i in1_21;
  __m256i in1_22;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  __m256i in0_14;
  __m256i in0_15;
  __m256i in0_16;
  __m256i in0_17;
  __m256i in0_18;
  __m256i in0_19;
  __m256i in0_20;
  __m256i in0_21;
  __m256i in0_22;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  uint uVar22;
  uint bit_00;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int32_t *piVar28;
  int in_ECX;
  uint uVar29;
  uint uVar30;
  uint in_EDX;
  undefined8 *in_RDI;
  int in_R8D;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined1 auVar39 [16];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i y;
  __m256i x;
  __m256i u [16];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  __m256i cospim52;
  __m256i cospim36;
  __m256i cospim48;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospi48;
  __m256i cospi32;
  __m256i cospi8;
  __m256i cospim40;
  __m256i cospi24;
  __m256i cospi56;
  __m256i cospi4;
  __m256i cospi12;
  __m256i cospi20;
  __m256i cospi44;
  __m256i cospi28;
  __m256i cospi60;
  int32_t *cospi;
  int iVar46;
  char local_128c;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  __m256i *in_stack_ffffffffffffedc0;
  __m256i *in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedd0;
  undefined4 in_stack_ffffffffffffedd4;
  int size;
  undefined8 in_stack_ffffffffffffedd8;
  undefined8 in_stack_ffffffffffffede0;
  undefined8 in_stack_ffffffffffffede8;
  longlong in_stack_ffffffffffffedf0;
  char local_11e4;
  char local_cec;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_230;
  undefined8 uStack_228;
  __m256i *local_180;
  __m256i *palStack_178;
  __m256i *palStack_170;
  __m256i *palStack_128;
  
  piVar28 = cospi_arr(in_EDX);
  uVar30 = piVar28[0x3c];
  auVar39 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
  auVar39 = vpinsrd_avx(auVar39,uVar30,2);
  vpinsrd_avx(auVar39,uVar30,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
  auVar39 = vpinsrd_avx(auVar39,uVar30,2);
  vpinsrd_avx(auVar39,uVar30,3);
  uVar30 = piVar28[0x1c];
  auVar39 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
  auVar39 = vpinsrd_avx(auVar39,uVar30,2);
  vpinsrd_avx(auVar39,uVar30,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
  auVar39 = vpinsrd_avx(auVar39,uVar30,2);
  vpinsrd_avx(auVar39,uVar30,3);
  uVar47 = piVar28[0x2c];
  auVar39 = vpinsrd_avx(ZEXT416(uVar47),uVar47,1);
  auVar39 = vpinsrd_avx(auVar39,uVar47,2);
  vpinsrd_avx(auVar39,uVar47,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar47),uVar47,1);
  auVar39 = vpinsrd_avx(auVar39,uVar47,2);
  vpinsrd_avx(auVar39,uVar47,3);
  uVar48 = piVar28[0x14];
  auVar39 = vpinsrd_avx(ZEXT416(uVar48),uVar48,1);
  auVar39 = vpinsrd_avx(auVar39,uVar48,2);
  vpinsrd_avx(auVar39,uVar48,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar48),uVar48,1);
  auVar39 = vpinsrd_avx(auVar39,uVar48,2);
  vpinsrd_avx(auVar39,uVar48,3);
  uVar49 = piVar28[0xc];
  auVar39 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar39 = vpinsrd_avx(auVar39,uVar49,2);
  vpinsrd_avx(auVar39,uVar49,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar49),uVar49,1);
  auVar39 = vpinsrd_avx(auVar39,uVar49,2);
  vpinsrd_avx(auVar39,uVar49,3);
  uVar50 = piVar28[4];
  auVar39 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar39 = vpinsrd_avx(auVar39,uVar50,2);
  vpinsrd_avx(auVar39,uVar50,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar50),uVar50,1);
  auVar39 = vpinsrd_avx(auVar39,uVar50,2);
  vpinsrd_avx(auVar39,uVar50,3);
  uVar51 = piVar28[0x38];
  auVar39 = vpinsrd_avx(ZEXT416(uVar51),uVar51,1);
  auVar39 = vpinsrd_avx(auVar39,uVar51,2);
  vpinsrd_avx(auVar39,uVar51,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar51),uVar51,1);
  auVar39 = vpinsrd_avx(auVar39,uVar51,2);
  vpinsrd_avx(auVar39,uVar51,3);
  uVar52 = piVar28[0x18];
  auVar39 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar39 = vpinsrd_avx(auVar39,uVar52,2);
  vpinsrd_avx(auVar39,uVar52,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar39 = vpinsrd_avx(auVar39,uVar52,2);
  vpinsrd_avx(auVar39,uVar52,3);
  uVar22 = -piVar28[0x28];
  auVar39 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar39 = vpinsrd_avx(auVar39,uVar22,2);
  vpinsrd_avx(auVar39,uVar22,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar39 = vpinsrd_avx(auVar39,uVar22,2);
  vpinsrd_avx(auVar39,uVar22,3);
  uVar53 = piVar28[8];
  auVar39 = vpinsrd_avx(ZEXT416(uVar53),uVar53,1);
  auVar39 = vpinsrd_avx(auVar39,uVar53,2);
  vpinsrd_avx(auVar39,uVar53,3);
  auVar39 = vpinsrd_avx(ZEXT416(uVar53),uVar53,1);
  auVar39 = vpinsrd_avx(auVar39,uVar53,2);
  vpinsrd_avx(auVar39,uVar53,3);
  uVar54 = piVar28[0x20];
  auVar39 = vpinsrd_avx(ZEXT416(uVar54),uVar54,1);
  auVar39 = vpinsrd_avx(auVar39,uVar54,2);
  auVar39 = vpinsrd_avx(auVar39,uVar54,3);
  auVar38 = vpinsrd_avx(ZEXT416(uVar54),uVar54,1);
  auVar38 = vpinsrd_avx(auVar38,uVar54,2);
  auVar38 = vpinsrd_avx(auVar38,uVar54,3);
  uStack_3f0 = auVar38._0_8_;
  uStack_3e8 = auVar38._8_8_;
  uVar55 = piVar28[0x30];
  auVar38 = vpinsrd_avx(ZEXT416(uVar55),uVar55,1);
  auVar38 = vpinsrd_avx(auVar38,uVar55,2);
  vpinsrd_avx(auVar38,uVar55,3);
  auVar38 = vpinsrd_avx(ZEXT416(uVar55),uVar55,1);
  auVar38 = vpinsrd_avx(auVar38,uVar55,2);
  vpinsrd_avx(auVar38,uVar55,3);
  uVar56 = piVar28[0x10];
  auVar38 = vpinsrd_avx(ZEXT416(uVar56),uVar56,1);
  auVar38 = vpinsrd_avx(auVar38,uVar56,2);
  vpinsrd_avx(auVar38,uVar56,3);
  auVar38 = vpinsrd_avx(ZEXT416(uVar56),uVar56,1);
  auVar38 = vpinsrd_avx(auVar38,uVar56,2);
  vpinsrd_avx(auVar38,uVar56,3);
  bit_00 = -piVar28[0x10];
  auVar38 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar38 = vpinsrd_avx(auVar38,bit_00,2);
  vpinsrd_avx(auVar38,bit_00,3);
  auVar38 = vpinsrd_avx(ZEXT416(bit_00),bit_00,1);
  auVar38 = vpinsrd_avx(auVar38,bit_00,2);
  vpinsrd_avx(auVar38,bit_00,3);
  uVar23 = -piVar28[0x30];
  auVar38 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar38 = vpinsrd_avx(auVar38,uVar23,2);
  vpinsrd_avx(auVar38,uVar23,3);
  auVar38 = vpinsrd_avx(ZEXT416(uVar23),uVar23,1);
  auVar38 = vpinsrd_avx(auVar38,uVar23,2);
  vpinsrd_avx(auVar38,uVar23,3);
  uVar24 = -piVar28[0x24];
  auVar38 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar38 = vpinsrd_avx(auVar38,uVar24,2);
  vpinsrd_avx(auVar38,uVar24,3);
  auVar38 = vpinsrd_avx(ZEXT416(uVar24),uVar24,1);
  auVar38 = vpinsrd_avx(auVar38,uVar24,2);
  vpinsrd_avx(auVar38,uVar24,3);
  uVar25 = -piVar28[0x34];
  auVar38 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar38 = vpinsrd_avx(auVar38,uVar25,2);
  vpinsrd_avx(auVar38,uVar25,3);
  auVar38 = vpinsrd_avx(ZEXT416(uVar25),uVar25,1);
  auVar38 = vpinsrd_avx(auVar38,uVar25,2);
  vpinsrd_avx(auVar38,uVar25,3);
  local_cec = (char)in_EDX;
  uVar26 = 1 << (local_cec - 1U & 0x1f);
  auVar38 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar38 = vpinsrd_avx(auVar38,uVar26,2);
  auVar38 = vpinsrd_avx(auVar38,uVar26,3);
  auVar37 = vpinsrd_avx(ZEXT416(uVar26),uVar26,1);
  auVar37 = vpinsrd_avx(auVar37,uVar26,2);
  auVar37 = vpinsrd_avx(auVar37,uVar26,3);
  auVar37 = ZEXT116(0) * auVar38 + ZEXT116(1) * auVar37;
  auVar38 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar38;
  uStack_230 = auVar38._0_8_;
  uStack_228 = auVar38._8_8_;
  iVar46 = 8;
  if (in_ECX != 0) {
    iVar46 = 6;
  }
  if (in_R8D + iVar46 < 0x10) {
    local_128c = '\x10';
  }
  else {
    local_128c = '\b';
    if (in_ECX != 0) {
      local_128c = '\x06';
    }
    local_128c = (char)in_R8D + local_128c;
  }
  uVar29 = -(1 << (local_128c - 1U & 0x1f));
  auVar38 = vpinsrd_avx(ZEXT416(uVar29),uVar29,1);
  auVar38 = vpinsrd_avx(auVar38,uVar29,2);
  vpinsrd_avx(auVar38,uVar29,3);
  auVar38 = vpinsrd_avx(ZEXT416(uVar29),uVar29,1);
  auVar38 = vpinsrd_avx(auVar38,uVar29,2);
  vpinsrd_avx(auVar38,uVar29,3);
  uVar27 = (1 << (local_128c - 1U & 0x1f)) - 1;
  auVar38 = vpinsrd_avx(ZEXT416(uVar27),uVar27,1);
  auVar38 = vpinsrd_avx(auVar38,uVar27,2);
  vpinsrd_avx(auVar38,uVar27,3);
  auVar38 = vpinsrd_avx(ZEXT416(uVar27),uVar27,1);
  auVar38 = vpinsrd_avx(auVar38,uVar27,2);
  vpinsrd_avx(auVar38,uVar27,3);
  uVar36 = *in_RDI;
  uVar45 = in_RDI[3];
  uVar31 = in_RDI[0x1c];
  uVar40 = in_RDI[0x1f];
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  uVar32 = uVar31;
  uVar41 = uVar40;
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  uVar33 = uVar32;
  uVar42 = uVar41;
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  uVar34 = uVar33;
  uVar43 = uVar42;
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  uVar35 = uVar34;
  uVar44 = uVar43;
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  in0[1] = in_stack_ffffffffffffede0;
  in0[0] = in_stack_ffffffffffffedd8;
  in0[2] = in_stack_ffffffffffffede8;
  in0[3] = in_stack_ffffffffffffedf0;
  in1[0]._4_4_ = uVar26;
  in1[0]._0_4_ = uVar25;
  in1[1] = (longlong)in_stack_ffffffffffffedc0;
  in1[2] = (longlong)in_stack_ffffffffffffedc8;
  in1[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_00[1] = in_stack_ffffffffffffede0;
  in0_00[0] = in_stack_ffffffffffffedd8;
  in0_00[2] = in_stack_ffffffffffffede8;
  in0_00[3] = in_stack_ffffffffffffedf0;
  in1_00[0]._4_4_ = uVar26;
  in1_00[0]._0_4_ = uVar25;
  in1_00[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_00[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_00[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_00[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_01[1] = in_stack_ffffffffffffede0;
  in0_01[0] = in_stack_ffffffffffffedd8;
  in0_01[2] = in_stack_ffffffffffffede8;
  in0_01[3] = in_stack_ffffffffffffedf0;
  in1_01[0]._4_4_ = uVar26;
  in1_01[0]._0_4_ = uVar25;
  in1_01[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_01[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_01[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_01[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_02[1] = in_stack_ffffffffffffede0;
  in0_02[0] = in_stack_ffffffffffffedd8;
  in0_02[2] = in_stack_ffffffffffffede8;
  in0_02[3] = in_stack_ffffffffffffedf0;
  in1_02[0]._4_4_ = uVar26;
  in1_02[0]._0_4_ = uVar25;
  in1_02[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_02[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_02[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_02[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  auVar14._8_8_ = uVar36;
  auVar14._0_8_ = uVar36;
  auVar14._16_8_ = uVar36;
  auVar14._24_8_ = uVar45;
  auVar13._16_8_ = uStack_3f0;
  auVar13._0_16_ = auVar39;
  auVar13._24_8_ = uStack_3e8;
  auVar1 = vpmulld_avx2(auVar14,auVar13);
  auVar21._16_8_ = uStack_230;
  auVar21._0_16_ = auVar37;
  auVar21._24_8_ = uStack_228;
  auVar1 = vpaddd_avx2(auVar1,auVar21);
  vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  half_btf_0_avx2((__m256i *)CONCAT44(uVar52,uVar51),(__m256i *)CONCAT44(uVar50,uVar49),
                  (__m256i *)CONCAT44(uVar48,uVar47),uVar30);
  in0_03[1] = in_stack_ffffffffffffede0;
  in0_03[0] = in_stack_ffffffffffffedd8;
  in0_03[2] = in_stack_ffffffffffffede8;
  in0_03[3] = in_stack_ffffffffffffedf0;
  in1_03[0]._4_4_ = uVar26;
  in1_03[0]._0_4_ = uVar25;
  in1_03[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_03[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_03[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_03[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_04[1] = in_stack_ffffffffffffede0;
  in0_04[0] = in_stack_ffffffffffffedd8;
  in0_04[2] = in_stack_ffffffffffffede8;
  in0_04[3] = in_stack_ffffffffffffedf0;
  in1_04[0]._4_4_ = uVar26;
  in1_04[0]._0_4_ = uVar25;
  in1_04[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_04[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_04[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_04[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  half_btf_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
                (__m256i *)CONCAT44(uVar26,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
                (__m256i *)CONCAT44(uVar26,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),bit_00);
  half_btf_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
                (__m256i *)CONCAT44(uVar26,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),bit_00);
  uVar36 = uVar33;
  uVar45 = uVar42;
  half_btf_avx2((__m256i *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
                (__m256i *)CONCAT44(uVar26,uVar25),(__m256i *)CONCAT44(uVar24,uVar23),bit_00);
  in0_05[1] = in_stack_ffffffffffffede0;
  in0_05[0] = in_stack_ffffffffffffedd8;
  in0_05[2] = in_stack_ffffffffffffede8;
  in0_05[3] = in_stack_ffffffffffffedf0;
  in1_05[0]._4_4_ = uVar26;
  in1_05[0]._0_4_ = uVar25;
  in1_05[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_05[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_05[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_05[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_06[1] = in_stack_ffffffffffffede0;
  in0_06[0] = in_stack_ffffffffffffedd8;
  in0_06[2] = in_stack_ffffffffffffede8;
  in0_06[3] = in_stack_ffffffffffffedf0;
  in1_06[0]._4_4_ = uVar26;
  in1_06[0]._0_4_ = uVar25;
  in1_06[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_06[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_06[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_06[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  auVar12._8_8_ = uVar34;
  auVar12._0_8_ = uVar34;
  auVar12._16_8_ = uVar34;
  auVar12._24_8_ = uVar43;
  auVar11._16_8_ = uStack_3f0;
  auVar11._0_16_ = auVar39;
  auVar11._24_8_ = uStack_3e8;
  auVar2 = vpmulld_avx2(auVar12,auVar11);
  auVar10._8_8_ = uVar35;
  auVar10._0_8_ = uVar35;
  auVar10._16_8_ = uVar35;
  auVar10._24_8_ = uVar44;
  auVar9._16_8_ = uStack_3f0;
  auVar9._0_16_ = auVar39;
  auVar9._24_8_ = uStack_3e8;
  auVar3 = vpmulld_avx2(auVar10,auVar9);
  auVar1 = vpsubd_avx2(auVar3,auVar2);
  auVar20._16_8_ = uStack_230;
  auVar20._0_16_ = auVar37;
  auVar20._24_8_ = uStack_228;
  auVar1 = vpaddd_avx2(auVar1,auVar20);
  vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  auVar1 = vpaddd_avx2(auVar3,auVar2);
  auVar19._16_8_ = uStack_230;
  auVar19._0_16_ = auVar37;
  auVar19._24_8_ = uStack_228;
  auVar1 = vpaddd_avx2(auVar1,auVar19);
  vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  in0_07[1] = in_stack_ffffffffffffede0;
  in0_07[0] = in_stack_ffffffffffffedd8;
  in0_07[2] = in_stack_ffffffffffffede8;
  in0_07[3] = in_stack_ffffffffffffedf0;
  in1_07[0]._4_4_ = uVar26;
  in1_07[0]._0_4_ = uVar25;
  in1_07[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_07[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_07[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_07[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_07,in1_07,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_08[1] = in_stack_ffffffffffffede0;
  in0_08[0] = in_stack_ffffffffffffedd8;
  in0_08[2] = in_stack_ffffffffffffede8;
  in0_08[3] = in_stack_ffffffffffffedf0;
  in1_08[0]._4_4_ = uVar26;
  in1_08[0]._0_4_ = uVar25;
  in1_08[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_08[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_08[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_08[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_08,in1_08,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_09[1] = in_stack_ffffffffffffede0;
  in0_09[0] = in_stack_ffffffffffffedd8;
  in0_09[2] = in_stack_ffffffffffffede8;
  in0_09[3] = in_stack_ffffffffffffedf0;
  in1_09[0]._4_4_ = uVar26;
  in1_09[0]._0_4_ = uVar25;
  in1_09[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_09[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_09[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_09[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_09,in1_09,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_10[1] = in_stack_ffffffffffffede0;
  in0_10[0] = in_stack_ffffffffffffedd8;
  in0_10[2] = in_stack_ffffffffffffede8;
  in0_10[3] = in_stack_ffffffffffffedf0;
  in1_10[0]._4_4_ = uVar26;
  in1_10[0]._0_4_ = uVar25;
  in1_10[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_10[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_10[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_10[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_10,in1_10,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_11[1] = in_stack_ffffffffffffede0;
  in0_11[0] = in_stack_ffffffffffffedd8;
  in0_11[2] = in_stack_ffffffffffffede8;
  in0_11[3] = in_stack_ffffffffffffedf0;
  in1_11[0]._4_4_ = uVar26;
  in1_11[0]._0_4_ = uVar25;
  in1_11[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_11[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_11[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_11[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_11,in1_11,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_12[1] = in_stack_ffffffffffffede0;
  in0_12[0] = in_stack_ffffffffffffedd8;
  in0_12[2] = in_stack_ffffffffffffede8;
  in0_12[3] = in_stack_ffffffffffffedf0;
  in1_12[0]._4_4_ = uVar26;
  in1_12[0]._0_4_ = uVar25;
  in1_12[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_12[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_12[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_12[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_12,in1_12,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_13[1] = in_stack_ffffffffffffede0;
  in0_13[0] = in_stack_ffffffffffffedd8;
  in0_13[2] = in_stack_ffffffffffffede8;
  in0_13[3] = in_stack_ffffffffffffedf0;
  in1_13[0]._4_4_ = uVar26;
  in1_13[0]._0_4_ = uVar25;
  in1_13[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_13[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_13[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_13[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_13,in1_13,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_14[1] = in_stack_ffffffffffffede0;
  in0_14[0] = in_stack_ffffffffffffedd8;
  in0_14[2] = in_stack_ffffffffffffede8;
  in0_14[3] = in_stack_ffffffffffffedf0;
  in1_14[0]._4_4_ = uVar26;
  in1_14[0]._0_4_ = uVar25;
  in1_14[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_14[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_14[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_14[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_14,in1_14,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  auVar8._8_8_ = uVar33;
  auVar8._0_8_ = uVar33;
  auVar8._16_8_ = uVar33;
  auVar8._24_8_ = uVar42;
  auVar7._16_8_ = uStack_3f0;
  auVar7._0_16_ = auVar39;
  auVar7._24_8_ = uStack_3e8;
  auVar2 = vpmulld_avx2(auVar8,auVar7);
  auVar6._8_8_ = uVar36;
  auVar6._0_8_ = uVar36;
  auVar6._16_8_ = uVar36;
  auVar6._24_8_ = uVar45;
  auVar5._16_8_ = uStack_3f0;
  auVar5._0_16_ = auVar39;
  auVar5._24_8_ = uStack_3e8;
  auVar3 = vpmulld_avx2(auVar6,auVar5);
  auVar1 = vpsubd_avx2(auVar3,auVar2);
  auVar18._16_8_ = uStack_230;
  auVar18._0_16_ = auVar37;
  auVar18._24_8_ = uStack_228;
  auVar1 = vpaddd_avx2(auVar1,auVar18);
  vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  auVar1 = vpaddd_avx2(auVar2,auVar3);
  auVar17._16_8_ = uStack_230;
  auVar17._0_16_ = auVar37;
  auVar17._24_8_ = uStack_228;
  auVar1 = vpaddd_avx2(auVar1,auVar17);
  vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  auVar4._8_8_ = uVar31;
  auVar4._0_8_ = uVar31;
  auVar4._16_8_ = uVar31;
  auVar4._24_8_ = uVar40;
  auVar2._16_8_ = uStack_3f0;
  auVar2._0_16_ = auVar39;
  auVar2._24_8_ = uStack_3e8;
  auVar2 = vpmulld_avx2(auVar4,auVar2);
  auVar3._8_8_ = uVar32;
  auVar3._0_8_ = uVar32;
  auVar3._16_8_ = uVar32;
  auVar3._24_8_ = uVar41;
  auVar1._16_8_ = uStack_3f0;
  auVar1._0_16_ = auVar39;
  auVar1._24_8_ = uStack_3e8;
  auVar3 = vpmulld_avx2(auVar3,auVar1);
  auVar1 = vpsubd_avx2(auVar3,auVar2);
  auVar16._16_8_ = uStack_230;
  auVar16._0_16_ = auVar37;
  auVar16._24_8_ = uStack_228;
  auVar1 = vpaddd_avx2(auVar1,auVar16);
  vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  auVar1 = vpaddd_avx2(auVar2,auVar3);
  auVar15._16_8_ = uStack_230;
  auVar15._0_16_ = auVar37;
  auVar15._24_8_ = uStack_228;
  auVar1 = vpaddd_avx2(auVar1,auVar15);
  vpsrad_avx2(auVar1,ZEXT416(in_EDX));
  in0_15[1] = in_stack_ffffffffffffede0;
  in0_15[0] = in_stack_ffffffffffffedd8;
  in0_15[2] = in_stack_ffffffffffffede8;
  in0_15[3] = in_stack_ffffffffffffedf0;
  in1_15[0]._4_4_ = uVar26;
  in1_15[0]._0_4_ = uVar25;
  in1_15[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_15[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_15[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_15[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_15,in1_15,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_16[1] = in_stack_ffffffffffffede0;
  in0_16[0] = in_stack_ffffffffffffedd8;
  in0_16[2] = in_stack_ffffffffffffede8;
  in0_16[3] = in_stack_ffffffffffffedf0;
  in1_16[0]._4_4_ = uVar26;
  in1_16[0]._0_4_ = uVar25;
  in1_16[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_16[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_16[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_16[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_16,in1_16,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_17[1] = in_stack_ffffffffffffede0;
  in0_17[0] = in_stack_ffffffffffffedd8;
  in0_17[2] = in_stack_ffffffffffffede8;
  in0_17[3] = in_stack_ffffffffffffedf0;
  in1_17[0]._4_4_ = uVar26;
  in1_17[0]._0_4_ = uVar25;
  in1_17[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_17[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_17[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_17[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_17,in1_17,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_18[1] = in_stack_ffffffffffffede0;
  in0_18[0] = in_stack_ffffffffffffedd8;
  in0_18[2] = in_stack_ffffffffffffede8;
  in0_18[3] = in_stack_ffffffffffffedf0;
  in1_18[0]._4_4_ = uVar26;
  in1_18[0]._0_4_ = uVar25;
  in1_18[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_18[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_18[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_18[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_18,in1_18,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_19[1] = in_stack_ffffffffffffede0;
  in0_19[0] = in_stack_ffffffffffffedd8;
  in0_19[2] = in_stack_ffffffffffffede8;
  in0_19[3] = in_stack_ffffffffffffedf0;
  in1_19[0]._4_4_ = uVar26;
  in1_19[0]._0_4_ = uVar25;
  in1_19[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_19[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_19[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_19[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_19,in1_19,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_20[1] = in_stack_ffffffffffffede0;
  in0_20[0] = in_stack_ffffffffffffedd8;
  in0_20[2] = in_stack_ffffffffffffede8;
  in0_20[3] = in_stack_ffffffffffffedf0;
  in1_20[0]._4_4_ = uVar26;
  in1_20[0]._0_4_ = uVar25;
  in1_20[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_20[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_20[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_20[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_20,in1_20,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_21[1] = in_stack_ffffffffffffede0;
  in0_21[0] = in_stack_ffffffffffffedd8;
  in0_21[2] = in_stack_ffffffffffffede8;
  in0_21[3] = in_stack_ffffffffffffedf0;
  in1_21[0]._4_4_ = uVar26;
  in1_21[0]._0_4_ = uVar25;
  in1_21[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_21[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_21[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_21[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_21,in1_21,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  in0_22[1] = in_stack_ffffffffffffede0;
  in0_22[0] = in_stack_ffffffffffffedd8;
  in0_22[2] = in_stack_ffffffffffffede8;
  in0_22[3] = in_stack_ffffffffffffedf0;
  in1_22[0]._4_4_ = uVar26;
  in1_22[0]._0_4_ = uVar25;
  in1_22[1] = (longlong)in_stack_ffffffffffffedc0;
  in1_22[2] = (longlong)in_stack_ffffffffffffedc8;
  in1_22[3]._0_4_ = in_stack_ffffffffffffedd0;
  in1_22[3]._4_4_ = in_stack_ffffffffffffedd4;
  addsub_avx2(in0_22,in1_22,(__m256i *)CONCAT44(uVar24,uVar23),(__m256i *)CONCAT44(bit_00,uVar56),
              (__m256i *)CONCAT44(uVar55,uVar54),(__m256i *)CONCAT44(uVar53,uVar22));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      iVar46 = 0x10;
    }
    else {
      iVar46 = in_R8D + 6;
    }
    local_11e4 = (char)iVar46;
    uVar30 = -(1 << (local_11e4 - 1U & 0x1f));
    auVar39 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
    auVar39 = vpinsrd_avx(auVar39,uVar30,2);
    auVar39 = vpinsrd_avx(auVar39,uVar30,3);
    auVar38 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
    auVar38 = vpinsrd_avx(auVar38,uVar30,2);
    auVar38 = vpinsrd_avx(auVar38,uVar30,3);
    local_180 = auVar39._0_8_;
    palStack_178 = auVar39._8_8_;
    palStack_170 = auVar38._0_8_;
    uVar30 = (1 << (local_11e4 - 1U & 0x1f)) - 1;
    auVar39 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
    auVar39 = vpinsrd_avx(auVar39,uVar30,2);
    auVar39 = vpinsrd_avx(auVar39,uVar30,3);
    auVar38 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
    auVar38 = vpinsrd_avx(auVar38,uVar30,2);
    vpinsrd_avx(auVar38,uVar30,3);
    auVar39 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
    palStack_128 = auVar39._8_8_;
    size = auVar39._4_4_;
    round_shift_8x8_avx2((__m256i *)CONCAT44(uVar29,iVar46),uVar30);
    highbd_clamp_epi32_avx2(palStack_170,palStack_178,local_180,palStack_128,size);
  }
  return;
}

Assistant:

static void idct16_low8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u[16], x, y;

  {
    // stage 0
    // stage 1
    u[0] = in[0];
    u[2] = in[4];
    u[4] = in[2];
    u[6] = in[6];
    u[8] = in[1];
    u[10] = in[5];
    u[12] = in[3];
    u[14] = in[7];

    // stage 2
    u[15] = half_btf_0_avx2(&cospi4, &u[8], &rnding, bit);
    u[8] = half_btf_0_avx2(&cospi60, &u[8], &rnding, bit);

    u[9] = half_btf_0_avx2(&cospim36, &u[14], &rnding, bit);
    u[14] = half_btf_0_avx2(&cospi28, &u[14], &rnding, bit);

    u[13] = half_btf_0_avx2(&cospi20, &u[10], &rnding, bit);
    u[10] = half_btf_0_avx2(&cospi44, &u[10], &rnding, bit);

    u[11] = half_btf_0_avx2(&cospim52, &u[12], &rnding, bit);
    u[12] = half_btf_0_avx2(&cospi12, &u[12], &rnding, bit);

    // stage 3
    u[7] = half_btf_0_avx2(&cospi8, &u[4], &rnding, bit);
    u[4] = half_btf_0_avx2(&cospi56, &u[4], &rnding, bit);
    u[5] = half_btf_0_avx2(&cospim40, &u[6], &rnding, bit);
    u[6] = half_btf_0_avx2(&cospi24, &u[6], &rnding, bit);

    addsub_avx2(u[8], u[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
    addsub_avx2(u[11], u[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(u[12], u[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
    addsub_avx2(u[15], u[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

    // stage 4
    x = _mm256_mullo_epi32(u[0], cospi32);
    u[0] = _mm256_add_epi32(x, rnding);
    u[0] = _mm256_srai_epi32(u[0], bit);
    u[1] = u[0];

    u[3] = half_btf_0_avx2(&cospi16, &u[2], &rnding, bit);
    u[2] = half_btf_0_avx2(&cospi48, &u[2], &rnding, bit);

    addsub_avx2(u[4], u[5], &u[4], &u[5], &clamp_lo, &clamp_hi);
    addsub_avx2(u[7], u[6], &u[7], &u[6], &clamp_lo, &clamp_hi);

    x = half_btf_avx2(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    u[14] = half_btf_avx2(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    u[9] = x;
    y = half_btf_avx2(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    u[13] = half_btf_avx2(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    u[10] = y;

    // stage 5
    addsub_avx2(u[0], u[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[2], &u[1], &u[2], &clamp_lo, &clamp_hi);

    x = _mm256_mullo_epi32(u[5], cospi32);
    y = _mm256_mullo_epi32(u[6], cospi32);
    u[5] = _mm256_sub_epi32(y, x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    u[6] = _mm256_add_epi32(y, x);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    addsub_avx2(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_avx2(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_avx2(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    // stage 6
    addsub_avx2(u[0], u[7], &u[0], &u[7], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[6], &u[1], &u[6], &clamp_lo, &clamp_hi);
    addsub_avx2(u[2], u[5], &u[2], &u[5], &clamp_lo, &clamp_hi);
    addsub_avx2(u[3], u[4], &u[3], &u[4], &clamp_lo, &clamp_hi);

    x = _mm256_mullo_epi32(u[10], cospi32);
    y = _mm256_mullo_epi32(u[13], cospi32);
    u[10] = _mm256_sub_epi32(y, x);
    u[10] = _mm256_add_epi32(u[10], rnding);
    u[10] = _mm256_srai_epi32(u[10], bit);

    u[13] = _mm256_add_epi32(x, y);
    u[13] = _mm256_add_epi32(u[13], rnding);
    u[13] = _mm256_srai_epi32(u[13], bit);

    x = _mm256_mullo_epi32(u[11], cospi32);
    y = _mm256_mullo_epi32(u[12], cospi32);
    u[11] = _mm256_sub_epi32(y, x);
    u[11] = _mm256_add_epi32(u[11], rnding);
    u[11] = _mm256_srai_epi32(u[11], bit);

    u[12] = _mm256_add_epi32(x, y);
    u[12] = _mm256_add_epi32(u[12], rnding);
    u[12] = _mm256_srai_epi32(u[12], bit);
    // stage 7
    addsub_avx2(u[0], u[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
    addsub_avx2(u[2], u[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
    addsub_avx2(u[3], u[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
    addsub_avx2(u[4], u[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
    addsub_avx2(u[5], u[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
    addsub_avx2(u[6], u[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
    addsub_avx2(u[7], u[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m256i clamp_lo_out =
          _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      const __m256i clamp_hi_out =
          _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
      round_shift_8x8_avx2(out, out_shift);
      highbd_clamp_epi32_avx2(out, out, &clamp_lo_out, &clamp_hi_out, 16);
    }
  }
}